

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O2

stb_sdict * stb_sdict_new(int use_arena)

{
  stb_sdict *psVar1;
  void *pvVar2;
  
  psVar1 = stb_sdict_create();
  if (psVar1 != (stb_sdict *)0x0) {
    if (use_arena == 0) {
      pvVar2 = (void *)0x0;
    }
    else {
      pvVar2 = stb_malloc_global(1);
    }
    psVar1->arena = pvVar2;
  }
  return psVar1;
}

Assistant:

stb_sdict * stb_sdict_new(int use_arena)
{
   stb_sdict *d = stb_sdict_create();
   if (d == NULL) return NULL;
   d->arena = use_arena ? stb_malloc_global(1) : NULL;
   return d;
}